

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::ProducedDirectoryNodeTask::inputsAvailable
          (ProducedDirectoryNodeTask *this,TaskInterface ti)

{
  bool bVar1;
  BuildSystemImpl *this_00;
  BuildSystemDelegate *pBVar2;
  TaskInterface ti_00;
  ValueType local_e8;
  BuildValue local_d0;
  ValueType local_60;
  ProducedDirectoryNodeTask *local_48;
  void *local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  ProducedDirectoryNodeTask *local_20;
  ProducedDirectoryNodeTask *this_local;
  TaskInterface ti_local;
  
  ti_00.ctx = ti.ctx;
  local_48 = (ProducedDirectoryNodeTask *)ti.impl;
  local_20 = this;
  this_local = local_48;
  ti_local.impl = ti_00.ctx;
  if ((this->returnDirectorySignature & 1U) == 0) {
    if ((this->isInvalid & 1U) == 0) {
      bVar1 = llbuild::buildsystem::BuildValue::isInvalid(&this->nodeResult);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!nodeResult.isInvalid()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                      ,0x37f,
                      "virtual void (anonymous namespace)::ProducedDirectoryNodeTask::inputsAvailable(TaskInterface)"
                     );
      }
      llbuild::buildsystem::BuildValue::toData(&local_e8,&this->nodeResult);
      llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_e8,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_e8);
    }
    else {
      ti_00.impl = ti_00.ctx;
      local_40 = ti_00.ctx;
      this_00 = getBuildSystem((anon_unknown_dwarf_ecf33 *)local_48,ti_00);
      pBVar2 = BuildSystemImpl::getDelegate(this_00);
      (*pBVar2->_vptr_BuildSystemDelegate[6])();
      llbuild::buildsystem::BuildValue::makeFailedInput();
      llbuild::buildsystem::BuildValue::toData(&local_60,&local_d0);
      llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_60,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_60);
      llbuild::buildsystem::BuildValue::~BuildValue(&local_d0);
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_38,&this->directorySignature);
    llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_38,false);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    if (returnDirectorySignature) {
      ti.complete(ValueType(directorySignature));
      return;
    } else {
      if (isInvalid) {
        getBuildSystem(ti).getDelegate().hadCommandFailure();
        ti.complete(BuildValue::makeFailedInput().toData());
        return;
      }
      assert(!nodeResult.isInvalid());
      
      // Complete the task immediately.
      ti.complete(nodeResult.toData());
    }
  }